

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semaphore.cpp
# Opt level: O0

PAL_ERROR CorUnix::InternalReleaseSemaphore
                    (CPalThread *pthr,HANDLE hSemaphore,LONG lReleaseCount,LPLONG lpPreviousCount)

{
  int local_4c;
  int *piStack_48;
  LONG lOldCount;
  SemaphoreImmutableData *pSemaphoreData;
  ISynchStateController *pssc;
  IPalObject *pobjSemaphore;
  LPLONG pLStack_28;
  PAL_ERROR palError;
  LPLONG lpPreviousCount_local;
  HANDLE pVStack_18;
  LONG lReleaseCount_local;
  HANDLE hSemaphore_local;
  CPalThread *pthr_local;
  
  pobjSemaphore._4_4_ = 0;
  pssc = (ISynchStateController *)0x0;
  pSemaphoreData = (SemaphoreImmutableData *)0x0;
  pLStack_28 = lpPreviousCount;
  lpPreviousCount_local._4_4_ = lReleaseCount;
  pVStack_18 = hSemaphore;
  hSemaphore_local = pthr;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalReleaseSemaphore",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/semaphore.cpp"
            ,0x1ca);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  if (lpPreviousCount_local._4_4_ < 1) {
    pobjSemaphore._4_4_ = 0x57;
  }
  else {
    pobjSemaphore._4_4_ =
         (**(code **)(*g_pObjectManager + 0x28))
                   (g_pObjectManager,hSemaphore_local,pVStack_18,&aotSempahore,0,&pssc);
    if (pobjSemaphore._4_4_ == 0) {
      pobjSemaphore._4_4_ = (*pssc->_vptr_ISynchStateController[2])(pssc,&stack0xffffffffffffffb8);
      if (pobjSemaphore._4_4_ == 0) {
        pobjSemaphore._4_4_ =
             (*pssc->_vptr_ISynchStateController[5])(pssc,hSemaphore_local,&pSemaphoreData);
        if (pobjSemaphore._4_4_ == 0) {
          pobjSemaphore._4_4_ = (*(code *)**(undefined8 **)pSemaphoreData)(pSemaphoreData,&local_4c)
          ;
          if (pobjSemaphore._4_4_ == 0) {
            if (*piStack_48 < local_4c) {
              fprintf(_stderr,"] %s %s:%d","InternalReleaseSemaphore",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/semaphore.cpp"
                      ,0x203);
              fprintf(_stderr,"Expression: lOldCount <= pSemaphoreData->lMaximumCount\n");
            }
            if (*piStack_48 - local_4c < lpPreviousCount_local._4_4_) {
              pobjSemaphore._4_4_ = 0x57;
            }
            else {
              pobjSemaphore._4_4_ =
                   (**(code **)(*(long *)pSemaphoreData + 0x10))
                             (pSemaphoreData,lpPreviousCount_local._4_4_);
              if (pobjSemaphore._4_4_ == 0) {
                if (pLStack_28 != (LPLONG)0x0) {
                  *pLStack_28 = local_4c;
                }
              }
              else {
                fprintf(_stderr,"] %s %s:%d","InternalReleaseSemaphore",
                        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/semaphore.cpp"
                        ,0x20e);
                fprintf(_stderr,"Error %d incrementing signal count\n",(ulong)pobjSemaphore._4_4_);
              }
            }
          }
          else {
            fprintf(_stderr,"] %s %s:%d","InternalReleaseSemaphore",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/semaphore.cpp"
                    ,0x1ff);
            fprintf(_stderr,"Error %d obtaining current signal count\n",(ulong)pobjSemaphore._4_4_);
          }
        }
        else {
          fprintf(_stderr,"] %s %s:%d","InternalReleaseSemaphore",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/semaphore.cpp"
                  ,0x1f7);
          fprintf(_stderr,"Error %d obtaining synch state controller\n",(ulong)pobjSemaphore._4_4_);
        }
      }
      else {
        fprintf(_stderr,"] %s %s:%d","InternalReleaseSemaphore",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/semaphore.cpp"
                ,0x1ec);
        fprintf(_stderr,"Error %d obtaining object data\n",(ulong)pobjSemaphore._4_4_);
      }
    }
    else if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
  }
  if (pSemaphoreData != (SemaphoreImmutableData *)0x0) {
    (**(code **)(*(long *)pSemaphoreData + 0x30))();
  }
  if (pssc != (ISynchStateController *)0x0) {
    (*pssc->_vptr_ISynchStateController[8])(pssc,hSemaphore_local);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return pobjSemaphore._4_4_;
  }
  abort();
}

Assistant:

PAL_ERROR
CorUnix::InternalReleaseSemaphore(
    CPalThread *pthr,
    HANDLE hSemaphore,
    LONG lReleaseCount,
    LPLONG lpPreviousCount
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjSemaphore = NULL;
    ISynchStateController *pssc = NULL;
    SemaphoreImmutableData *pSemaphoreData;
    LONG lOldCount;

    _ASSERTE(NULL != pthr);

    ENTRY("InternalReleaseSempahore(pthr=%p, hSemaphore=%p, lReleaseCount=%d, "
        "lpPreviousCount=%p)\n",
        pthr,
        hSemaphore,
        lReleaseCount,
        lpPreviousCount
        );

    if (0 >= lReleaseCount)
    {
        palError = ERROR_INVALID_PARAMETER;
        goto InternalReleaseSemaphoreExit;
    }

    palError = g_pObjectManager->ReferenceObjectByHandle(
        pthr,
        hSemaphore,
        &aotSempahore,
        0, // Should be SEMAPHORE_MODIFY_STATE; currently ignored (no Win32 security)
        &pobjSemaphore
        );

    if (NO_ERROR != palError)
    {
        ERROR("Unable to obtain object for handle %p (error %d)!\n", hSemaphore, palError);
        goto InternalReleaseSemaphoreExit;
    }

    palError = pobjSemaphore->GetImmutableData(reinterpret_cast<void**>(&pSemaphoreData));

    if (NO_ERROR != palError)
    {
        ASSERT("Error %d obtaining object data\n", palError);
        goto InternalReleaseSemaphoreExit;
    }

    palError = pobjSemaphore->GetSynchStateController(
        pthr,
        &pssc
        );

    if (NO_ERROR != palError)
    {
        ASSERT("Error %d obtaining synch state controller\n", palError);
        goto InternalReleaseSemaphoreExit;
    }

    palError = pssc->GetSignalCount(&lOldCount);

    if (NO_ERROR != palError)
    {
        ASSERT("Error %d obtaining current signal count\n", palError);
        goto InternalReleaseSemaphoreExit;
    }

    _ASSERTE(lOldCount <= pSemaphoreData->lMaximumCount);
    if (lReleaseCount > pSemaphoreData->lMaximumCount - lOldCount)
    {
        palError = ERROR_INVALID_PARAMETER;
        goto InternalReleaseSemaphoreExit;
    }

    palError = pssc->IncrementSignalCount(lReleaseCount);

    if (NO_ERROR != palError)
    {
        ASSERT("Error %d incrementing signal count\n", palError);
        goto InternalReleaseSemaphoreExit;
    }

    if (NULL != lpPreviousCount)
    {
        *lpPreviousCount = lOldCount;
    }

InternalReleaseSemaphoreExit:

    if (NULL != pssc)
    {
        pssc->ReleaseController();
    }

    if (NULL != pobjSemaphore)
    {
        pobjSemaphore->ReleaseReference(pthr);
    }

    LOGEXIT("InternalReleaseSemaphore returns %d\n", palError);

    return palError;
}